

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::NearestNeighborsIndex::Clear(NearestNeighborsIndex *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
            (&(this->floatsamples_).super_RepeatedPtrFieldBase);
  this->numberofdimensions_ = 0;
  clear_IndexType(this);
  clear_DistanceFunction(this);
  return;
}

Assistant:

void NearestNeighborsIndex::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NearestNeighborsIndex)
  floatsamples_.Clear();
  numberofdimensions_ = 0;
  clear_IndexType();
  clear_DistanceFunction();
}